

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::
unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
::
unordered_flat_map<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>const*>
          (unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
           *this,pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>
                 *first,
          pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>
          *last,size_type n,hasher *h,key_equal *pred,allocator_type *a)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint64_t hash;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>
  *pos;
  undefined1 auVar15 [16];
  locator res;
  locator local_48;
  
  detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>_>_>
  ::new_(this,&local_48,n);
  uVar13 = *(long *)(this + 8) * 0xf + 0xe;
  if (*(long *)(this + 0x18) == 0) {
    uVar13 = 0;
  }
  uVar11 = (ulong)((float)uVar13 * 0.875);
  uVar11 = (long)((float)uVar13 * 0.875 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
  if (uVar13 < 0x1e) {
    uVar11 = uVar13;
  }
  *(ulong *)(this + 0x20) = uVar11;
  *(undefined8 *)(this + 0x28) = 0;
  if (first != last) {
    do {
      hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this,
                        &first->first);
      uVar11 = hash >> ((byte)*this & 0x3f);
      lVar12 = (hash & 0xff) * 4;
      cVar4 = (&UNK_0047072c)[lVar12];
      cVar5 = (&UNK_0047072d)[lVar12];
      cVar6 = (&UNK_0047072e)[lVar12];
      bVar7 = (&UNK_0047072f)[lVar12];
      uVar14 = 0;
      uVar13 = uVar11;
      do {
        lVar12 = *(long *)(this + 0x10);
        pcVar1 = (char *)(lVar12 + uVar13 * 0x10);
        bVar9 = pcVar1[0xf];
        auVar15[0] = -(*pcVar1 == cVar4);
        auVar15[1] = -(pcVar1[1] == cVar5);
        auVar15[2] = -(pcVar1[2] == cVar6);
        auVar15[3] = -(pcVar1[3] == bVar7);
        auVar15[4] = -(pcVar1[4] == cVar4);
        auVar15[5] = -(pcVar1[5] == cVar5);
        auVar15[6] = -(pcVar1[6] == cVar6);
        auVar15[7] = -(pcVar1[7] == bVar7);
        auVar15[8] = -(pcVar1[8] == cVar4);
        auVar15[9] = -(pcVar1[9] == cVar5);
        auVar15[10] = -(pcVar1[10] == cVar6);
        auVar15[0xb] = -(pcVar1[0xb] == bVar7);
        auVar15[0xc] = -(pcVar1[0xc] == cVar4);
        auVar15[0xd] = -(pcVar1[0xd] == cVar5);
        auVar15[0xe] = -(pcVar1[0xe] == cVar6);
        auVar15[0xf] = -(bVar9 == bVar7);
        uVar10 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
        if (uVar10 != 0) {
          lVar2 = *(long *)(this + 0x18);
          do {
            uVar3 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               this,&first->first,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               ((ulong)uVar3 * 0x18 + lVar2 + uVar13 * 0x168));
            if (bVar8) goto LAB_0044d339;
            uVar10 = uVar10 - 1 & uVar10;
          } while (uVar10 != 0);
          bVar9 = *(byte *)(lVar12 + uVar13 * 0x10 + 0xf);
        }
        if (((&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
               is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar9) == 0) break;
        lVar12 = uVar13 + uVar14;
        uVar14 = uVar14 + 1;
        uVar13 = lVar12 + 1U & *(ulong *)(this + 8);
      } while (uVar14 <= *(ulong *)(this + 8));
      if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
        detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
        ::
        nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>const&>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
                    *)this,(arrays_type *)this,uVar11,hash,first);
        *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
      }
      else {
        detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
        ::
        unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>const&>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
                    *)this,hash,first);
      }
LAB_0044d339:
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

unordered_flat_map(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_map(n, h, pred, a) {
        this->insert(first, last);
    }